

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

double av1_tpl_compute_frame_mv_entropy(TplDepFrame *tpl_frame,uint8_t right_shift)

{
  int step_00;
  int_mv iVar1;
  int iVar2;
  byte in_SIL;
  char *in_RDI;
  double dVar3;
  double p_1;
  double p;
  int i;
  double rate_col;
  double rate_row;
  int_mv mv;
  int col;
  int row;
  int step;
  int tpl_stride;
  int n;
  int count_col [500];
  int count_row [500];
  int local_fe4;
  double local_fe0;
  double local_fd8;
  short local_fd0;
  int right_shift_00;
  int tpl_stride_00;
  int iVar4;
  int row_00;
  TplDepFrame *in_stack_fffffffffffff048;
  int local_7e8 [501];
  byte local_11;
  char *local_10;
  double local_8;
  
  if (*in_RDI == '\0') {
    local_8 = 0.0;
  }
  else {
    local_11 = in_SIL;
    local_10 = in_RDI;
    memset(local_7e8,0,2000);
    memset(&stack0xfffffffffffff048,0,2000);
    row_00 = 0;
    iVar4 = *(int *)(local_10 + 0x40);
    step_00 = 1 << (local_11 & 0x1f);
    for (tpl_stride_00 = 0; tpl_stride_00 < *(int *)(local_10 + 0x4c);
        tpl_stride_00 = step_00 + tpl_stride_00) {
      for (right_shift_00 = 0; right_shift_00 < *(int *)(local_10 + 0x50);
          right_shift_00 = step_00 + right_shift_00) {
        iVar1 = av1_compute_mv_difference
                          (in_stack_fffffffffffff048,row_00,iVar4,step_00,tpl_stride_00,
                           right_shift_00);
        local_fd0 = iVar1.as_mv.row;
        iVar2 = clamp((int)local_fd0,0,499);
        local_7e8[iVar2] = local_7e8[iVar2] + 1;
        iVar2 = clamp((int)local_fd0,0,499);
        *(int *)(&stack0xfffffffffffff048 + (long)iVar2 * 4) =
             *(int *)(&stack0xfffffffffffff048 + (long)iVar2 * 4) + 1;
        row_00 = row_00 + 1;
      }
    }
    local_fd8 = 0.0;
    local_fe0 = 0.0;
    for (local_fe4 = 0; local_fe4 < 500; local_fe4 = local_fe4 + 1) {
      if (local_7e8[local_fe4] != 0) {
        iVar4 = local_7e8[local_fe4];
        dVar3 = log2((double)local_7e8[local_fe4] / (double)row_00);
        local_fd8 = (double)iVar4 * -dVar3 + local_fd8;
      }
      if (*(int *)(&stack0xfffffffffffff048 + (long)local_fe4 * 4) != 0) {
        iVar4 = *(int *)(&stack0xfffffffffffff048 + (long)local_fe4 * 4);
        dVar3 = log2((double)*(int *)(&stack0xfffffffffffff048 + (long)local_fe4 * 4) /
                     (double)row_00);
        local_fe0 = (double)iVar4 * -dVar3 + local_fe0;
      }
    }
    local_8 = local_fd8 + local_fe0;
  }
  return local_8;
}

Assistant:

double av1_tpl_compute_frame_mv_entropy(const TplDepFrame *tpl_frame,
                                        uint8_t right_shift) {
  if (!tpl_frame->is_valid) {
    return 0;
  }

  int count_row[500] = { 0 };
  int count_col[500] = { 0 };
  int n = 0;  // number of MVs to process

  const int tpl_stride = tpl_frame->stride;
  const int step = 1 << right_shift;

  for (int row = 0; row < tpl_frame->mi_rows; row += step) {
    for (int col = 0; col < tpl_frame->mi_cols; col += step) {
      int_mv mv = av1_compute_mv_difference(tpl_frame, row, col, step,
                                            tpl_stride, right_shift);
      count_row[clamp(mv.as_mv.row, 0, 499)] += 1;
      count_col[clamp(mv.as_mv.row, 0, 499)] += 1;
      n += 1;
    }
  }

  // Estimate the bits used using the entropy formula.
  double rate_row = 0;
  double rate_col = 0;
  for (int i = 0; i < 500; i++) {
    if (count_row[i] != 0) {
      double p = count_row[i] / (double)n;
      rate_row += count_row[i] * -log2(p);
    }
    if (count_col[i] != 0) {
      double p = count_col[i] / (double)n;
      rate_col += count_col[i] * -log2(p);
    }
  }

  return rate_row + rate_col;
}